

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_key.cpp
# Opt level: O0

int CfdPrivkeyTweakAdd(void *handle,char *privkey,char *tweak,char **output)

{
  bool bVar1;
  undefined8 uVar2;
  char *pcVar3;
  undefined8 *in_RCX;
  char *in_RDX;
  char *in_RSI;
  CfdException *except;
  exception *std_except;
  ByteData256 tweak_data;
  Privkey key;
  KeyApi api;
  string *in_stack_fffffffffffffdd0;
  undefined8 in_stack_fffffffffffffdd8;
  CfdError error_code;
  allocator *paVar4;
  CfdException *in_stack_fffffffffffffde0;
  string *in_stack_fffffffffffffe20;
  bool *in_stack_fffffffffffffe30;
  NetType *in_stack_fffffffffffffe38;
  string *in_stack_fffffffffffffe40;
  KeyApi *in_stack_fffffffffffffe48;
  string local_1a0;
  allocator local_179;
  string local_178;
  ByteData256 local_158;
  allocator local_139;
  string local_138 [32];
  Privkey local_118;
  KeyApi local_f3;
  undefined1 local_f2;
  allocator local_f1;
  string local_f0 [32];
  CfdSourceLocation local_d0;
  undefined1 local_b2;
  allocator local_b1;
  string local_b0 [32];
  CfdSourceLocation local_90;
  undefined1 local_72;
  allocator local_71;
  string local_70 [32];
  CfdSourceLocation local_50;
  undefined8 *local_28;
  char *local_20;
  char *local_18;
  int local_4;
  
  error_code = (CfdError)((ulong)in_stack_fffffffffffffdd8 >> 0x20);
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  cfd::Initialize();
  if (local_28 == (undefined8 *)0x0) {
    local_50.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/src/capi/cfdcapi_key.cpp"
                 ,0x2f);
    local_50.filename = local_50.filename + 1;
    local_50.line = 0x60a;
    local_50.funcname = "CfdPrivkeyTweakAdd";
    cfd::core::logger::warn<>(&local_50,"output is null.");
    local_72 = 1;
    uVar2 = __cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_70,"Failed to parameter. output is null.",&local_71);
    cfd::core::CfdException::CfdException
              (in_stack_fffffffffffffde0,error_code,in_stack_fffffffffffffdd0);
    local_72 = 0;
    __cxa_throw(uVar2,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  bVar1 = cfd::capi::IsEmptyString(local_18);
  if (!bVar1) {
    bVar1 = cfd::capi::IsEmptyString(local_20);
    if (!bVar1) {
      cfd::api::KeyApi::KeyApi(&local_f3);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_138,local_18,&local_139);
      cfd::api::KeyApi::GetPrivkey
                (in_stack_fffffffffffffe48,in_stack_fffffffffffffe40,in_stack_fffffffffffffe38,
                 in_stack_fffffffffffffe30);
      std::__cxx11::string::~string(local_138);
      std::allocator<char>::~allocator((allocator<char> *)&local_139);
      paVar4 = &local_179;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_178,local_20,paVar4);
      cfd::core::ByteData256::ByteData256(&local_158,&local_178);
      std::__cxx11::string::~string((string *)&local_178);
      std::allocator<char>::~allocator((allocator<char> *)&local_179);
      cfd::core::Privkey::CreateTweakAdd((Privkey *)&stack0xfffffffffffffe40,&local_118,&local_158);
      cfd::core::Privkey::GetHex_abi_cxx11_(&local_1a0,(Privkey *)&stack0xfffffffffffffe40);
      pcVar3 = cfd::capi::CreateString(in_stack_fffffffffffffe20);
      *local_28 = pcVar3;
      std::__cxx11::string::~string((string *)&local_1a0);
      cfd::core::Privkey::~Privkey((Privkey *)0x60ba92);
      local_4 = 0;
      cfd::core::ByteData256::~ByteData256((ByteData256 *)0x60baaa);
      cfd::core::Privkey::~Privkey((Privkey *)0x60bab7);
      return local_4;
    }
    local_d0.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/src/capi/cfdcapi_key.cpp"
                 ,0x2f);
    local_d0.filename = local_d0.filename + 1;
    local_d0.line = 0x616;
    local_d0.funcname = "CfdPrivkeyTweakAdd";
    cfd::core::logger::warn<>(&local_d0,"tweak is null or empty.");
    local_f2 = 1;
    uVar2 = __cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_f0,"Failed to parameter. tweak is null or empty.",&local_f1);
    cfd::core::CfdException::CfdException
              (in_stack_fffffffffffffde0,error_code,in_stack_fffffffffffffdd0);
    local_f2 = 0;
    __cxa_throw(uVar2,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  local_90.filename =
       strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/src/capi/cfdcapi_key.cpp"
               ,0x2f);
  local_90.filename = local_90.filename + 1;
  local_90.line = 0x610;
  local_90.funcname = "CfdPrivkeyTweakAdd";
  cfd::core::logger::warn<>(&local_90,"privkey is null or empty.");
  local_b2 = 1;
  uVar2 = __cxa_allocate_exception(0x30);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_b0,"Failed to parameter. privkey is null or empty.",&local_b1);
  cfd::core::CfdException::CfdException
            (in_stack_fffffffffffffde0,error_code,in_stack_fffffffffffffdd0);
  local_b2 = 0;
  __cxa_throw(uVar2,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
}

Assistant:

int CfdPrivkeyTweakAdd(
    void* handle, const char* privkey, const char* tweak, char** output) {
  try {
    cfd::Initialize();
    if (output == nullptr) {
      warn(CFD_LOG_SOURCE, "output is null.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. output is null.");
    }
    if (IsEmptyString(privkey)) {
      warn(CFD_LOG_SOURCE, "privkey is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. privkey is null or empty.");
    }
    if (IsEmptyString(tweak)) {
      warn(CFD_LOG_SOURCE, "tweak is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. tweak is null or empty.");
    }

    KeyApi api;
    Privkey key = api.GetPrivkey(std::string(privkey), nullptr, nullptr);
    ByteData256 tweak_data(tweak);
    *output = CreateString(key.CreateTweakAdd(tweak_data).GetHex());

    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    return SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
    return CfdErrorCode::kCfdUnknownError;
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
    return CfdErrorCode::kCfdUnknownError;
  }
}